

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O0

void bfgs_iter_start<dense_parameters>
               (vw *all,bfgs *b,float *mem,int *lastj,double importance_weight_sum,int *origin,
               dense_parameters *weights)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  uint32_t uVar4;
  char *pcVar5;
  long lVar6;
  float *pfVar7;
  undefined4 *in_RCX;
  int __c;
  long in_RDX;
  long in_RSI;
  dense_iterator<float> *rhs;
  long in_RDI;
  int *in_R8;
  dense_parameters *in_R9;
  double in_XMM0_Qa;
  float *mem1;
  iterator w;
  double g1_g1;
  double g1_Hg1;
  dense_parameters *in_stack_ffffffffffffff50;
  dense_iterator<float> local_78;
  dense_iterator<float> local_60;
  double local_48;
  double local_40;
  dense_parameters *local_38;
  int *local_30;
  double local_28;
  undefined4 *local_20;
  long local_18;
  long local_10;
  long local_8;
  
  local_40 = 0.0;
  local_48 = 0.0;
  *in_R8 = 0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_XMM0_Qa;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  dense_parameters::begin(in_stack_ffffffffffffff50);
  while( true ) {
    dense_parameters::end(in_stack_ffffffffffffff50);
    rhs = &local_78;
    bVar3 = dense_iterator<float>::operator!=(&local_60,rhs);
    lVar6 = local_18;
    if (!bVar3) break;
    pcVar5 = dense_iterator<float>::index(&local_60,(char *)rhs,__c);
    uVar4 = dense_parameters::stride_shift(local_38);
    lVar6 = lVar6 + ((ulong)pcVar5 >> ((byte)uVar4 & 0x3f)) * (long)*(int *)(local_10 + 0xb4) * 4;
    if (0 < *(int *)(local_10 + 8)) {
      pfVar7 = dense_iterator<float>::operator*(&local_60);
      *(float *)(lVar6 + (long)((*local_30 + 1) % *(int *)(local_10 + 0xb4)) * 4) = *pfVar7;
    }
    pfVar7 = dense_iterator<float>::operator*(&local_60);
    *(float *)(lVar6 + (long)(*local_30 % *(int *)(local_10 + 0xb4)) * 4) = pfVar7[1];
    pfVar7 = dense_iterator<float>::operator*(&local_60);
    fVar1 = pfVar7[1];
    pfVar7 = dense_iterator<float>::operator*(&local_60);
    in_stack_ffffffffffffff50 = (dense_parameters *)((double)fVar1 * (double)pfVar7[1]);
    pfVar7 = dense_iterator<float>::operator*(&local_60);
    local_40 = (double)in_stack_ffffffffffffff50 * (double)pfVar7[3] + local_40;
    pfVar7 = dense_iterator<float>::operator*(&local_60);
    fVar1 = pfVar7[1];
    pfVar7 = dense_iterator<float>::operator*(&local_60);
    local_48 = (double)fVar1 * (double)pfVar7[1] + local_48;
    pfVar7 = dense_iterator<float>::operator*(&local_60);
    fVar1 = pfVar7[3];
    pfVar7 = dense_iterator<float>::operator*(&local_60);
    fVar2 = pfVar7[1];
    pfVar7 = dense_iterator<float>::operator*(&local_60);
    pfVar7[2] = -fVar1 * fVar2;
    pfVar7 = dense_iterator<float>::operator*(&local_60);
    pfVar7[1] = 0.0;
    dense_iterator<float>::operator++(&local_60);
  }
  *local_20 = 0;
  if ((*(byte *)(local_8 + 0x3439) & 1) == 0) {
    fprintf(_stderr,"%-10.5f\t%-10.5f\t%-10s\t%-10s\t%-10s\t",local_48 / (local_28 * local_28),
            local_40 / local_28,"","");
  }
  return;
}

Assistant:

void bfgs_iter_start(vw& all, bfgs& b, float* mem, int& lastj, double importance_weight_sum, int& origin, T& weights)
{
  double g1_Hg1 = 0.;
  double g1_g1 = 0.;

  origin = 0;
  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    float* mem1 = mem + (w.index() >> weights.stride_shift()) * b.mem_stride;
    if (b.m > 0)
      mem1[(MEM_XT + origin) % b.mem_stride] = (&(*w))[W_XT];
    mem1[(MEM_GT + origin) % b.mem_stride] = (&(*w))[W_GT];
    g1_Hg1 += ((double)(&(*w))[W_GT]) * ((&(*w))[W_GT]) * ((&(*w))[W_COND]);
    g1_g1 += ((double)((&(*w))[W_GT])) * ((&(*w))[W_GT]);
    (&(*w))[W_DIR] = -(&(*w))[W_COND] * ((&(*w))[W_GT]);
    ((&(*w))[W_GT]) = 0;
  }
  lastj = 0;
  if (!all.quiet)
    fprintf(stderr, "%-10.5f\t%-10.5f\t%-10s\t%-10s\t%-10s\t", g1_g1 / (importance_weight_sum * importance_weight_sum),
        g1_Hg1 / importance_weight_sum, "", "", "");
}